

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O0

size_t qHash(QCborMap *map,size_t seed)

{
  size_t sVar1;
  const_iterator cVar2;
  QCborValueConstRef in_stack_00000000;
  QCborValueConstRef in_stack_00000010;
  
  QCborMap::begin((QCborMap *)0x47420c);
  cVar2 = QCborMap::end((QCborMap *)0x474220);
  sVar1 = qHashRange<QCborMap::ConstIterator>
                    ((ConstIterator)in_stack_00000010,(ConstIterator)in_stack_00000000,cVar2.item.i)
  ;
  return sVar1;
}

Assistant:

size_t qHash(const QCborMap &map, size_t seed)
{
    return qHashRange(map.begin(), map.end(), seed);
}